

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O1

bool __thiscall
M7Getter::ParseRecord
          (M7Getter *this,char *buffer,char **p_tld,size_t *tld_length,bool *has_ds,
          uint32_t *algo_code)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  
  *p_tld = buffer;
  *tld_length = 0;
  *has_ds = false;
  *algo_code = 0;
  bVar9 = *buffer;
  iVar5 = 0;
  bVar4 = false;
  uVar7 = 0;
  if (bVar9 != 0) {
    do {
      if ((0x19 < (byte)((bVar9 & 0xdf) + 0xbf)) && (bVar9 != 0x2d && 9 < (byte)(bVar9 - 0x30))) {
        if (bVar9 != 0x2e) break;
        iVar5 = iVar5 + 1;
      }
      bVar9 = buffer[uVar7 + 1];
      uVar7 = uVar7 + 1;
    } while (bVar9 != 0);
    bVar4 = 1 < iVar5;
  }
  if (uVar7 < 3 || bVar4) {
    return false;
  }
  *tld_length = uVar7 - 1;
  if ((buffer[uVar7] == ' ') || (buffer[uVar7] == '\t')) {
    do {
      do {
        uVar7 = uVar7 + 1;
      } while (buffer[uVar7] == ' ');
    } while (buffer[uVar7] == '\t');
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  if ((byte)(buffer[uVar7] - 0x3aU) < 0xf6) {
    bVar4 = false;
  }
  else {
    do {
      lVar8 = uVar7 + 1;
      uVar7 = uVar7 + 1;
    } while ((byte)(buffer[lVar8] - 0x30U) < 10);
  }
  if ((buffer[uVar7] == ' ') || (buffer[uVar7] == '\t')) {
    do {
      do {
        uVar7 = uVar7 + 1;
      } while (buffer[uVar7] == ' ');
    } while (buffer[uVar7] == '\t');
  }
  else {
    bVar4 = false;
  }
  if (((byte)(buffer[uVar7] | 0x20U) == 0x69) && ((byte)(buffer[uVar7 + 1] | 0x20U) == 0x6e)) {
    uVar7 = uVar7 + 2;
  }
  else {
    bVar4 = false;
  }
  if ((buffer[uVar7] == ' ') || (buffer[uVar7] == '\t')) {
    do {
      do {
        uVar7 = uVar7 + 1;
      } while (buffer[uVar7] == ' ');
    } while (buffer[uVar7] == '\t');
  }
  else {
    bVar4 = false;
  }
  if ((((byte)(buffer[uVar7] | 0x20U) == 100) && ((byte)(buffer[uVar7 + 1] | 0x20U) == 0x73)) &&
     ((buffer[uVar7 + 2] == ' ' || (buffer[uVar7 + 2] == '\t')))) {
    *has_ds = true;
    for (lVar8 = uVar7 + 3; (cVar1 = buffer[lVar8], cVar1 == ' ' || (cVar1 == '\t'));
        lVar8 = lVar8 + 1) {
    }
    if ((byte)(cVar1 - 0x3aU) < 0xf6) {
      bVar4 = false;
    }
    else {
      do {
        lVar3 = lVar8 + 1;
        lVar8 = lVar8 + 1;
      } while ((byte)(buffer[lVar3] - 0x30U) < 10);
    }
    if ((buffer[lVar8] == ' ') || (buffer[lVar8] == '\t')) {
      do {
        do {
          lVar8 = lVar8 + 1;
        } while (buffer[lVar8] == ' ');
      } while (buffer[lVar8] == '\t');
    }
    else {
      bVar4 = false;
    }
    if ((byte)(buffer[lVar8] - 0x3aU) < 0xf6) {
      return false;
    }
    if ((byte)(buffer[lVar8] - 0x30U) < 10) {
      uVar10 = *algo_code;
      pcVar2 = buffer + lVar8;
      do {
        pcVar6 = pcVar2 + 1;
        if (0x1ffffff < uVar10) {
          return false;
        }
        *algo_code = uVar10 * 10;
        uVar10 = ((int)*pcVar2 + uVar10 * 10) - 0x30;
        *algo_code = uVar10;
        pcVar2 = pcVar6;
      } while ((byte)(*pcVar6 - 0x30U) < 10);
    }
  }
  return bVar4;
}

Assistant:

bool M7Getter::ParseRecord(char * buffer, char ** p_tld, size_t * tld_length, bool * has_ds, uint32_t* algo_code)
{
    bool ret = true;
    size_t i = 0;
    int x;
    int nb_dots = 0;


    *p_tld = buffer;
    *tld_length = 0;
    *has_ds = false;
    *algo_code = 0;

    for (i = 0; (x = buffer[i]) != 0; i++)
    {
        if ((x >= 'a' && x <= 'z') || (x >= 'A' && x <= 'Z') ||
            (x >= '0' && x <= '9') || (x == '-'))
        {
            continue;
        }
        else if (x == '.')
        {
            nb_dots++;
        }
        else
        {
            break;
        }
    }

    if (i <= 2 || nb_dots > 1)
    {
        ret = false;
    }
    else
    {
        *tld_length = i - 1;

        /* skip spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip TTL */
        if (buffer[i] < '0' || buffer[i] > '9')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] >= '0' && buffer[i] <= '9');
        }
        /* skip more spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip CLASS */
        if ((buffer[i] == 'i' || buffer[i] == 'I') &&
            (buffer[i+1] == 'n' || buffer[i+1] == 'N'))
        {
            i += 2;
        }
        else
        {
            ret = false;
        }
        /* skip more space*/
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* check ds_bit */
        if ((buffer[i] == 'd' || buffer[i] == 'D') &&
            (buffer[i + 1] == 's' || buffer[i + 1] == 'S') &&
            (buffer[i + 2] == ' ' || buffer[i + 2] == '\t'))
        {
            *has_ds = true;
            i += 2;
            /* skip space until next number */
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');

            /* skip digits (key ID) */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] >= '0' && buffer[i] <= '9');
            }
            /* Skip more spaces */
            if (buffer[i] != ' ' && buffer[i] != '\t')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] == ' ' || buffer[i] == '\t');
            }
            /* Compute algorithm number */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else while (buffer[i] >= '0' && buffer[i] <= '9')
            {
                if (*algo_code > 0x1FFFFFF) {
                    ret = false;
                    break;
                }
                *algo_code *= 10;
                *algo_code += (uint32_t)(buffer[i] - '0');
                i++;
            }
        }
    }

    return ret;
}